

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void helics::timerTickHandler(BrokerBase *bbase,activeProtector *active,error_code *error)

{
  bool bVar1;
  pair<bool,_bool> *ppVar2;
  error_code *in_RDX;
  ActionMessage tick;
  exception *e;
  handle timeProtector;
  ActionMessage *in_stack_fffffffffffffe18;
  BrokerBase *in_stack_fffffffffffffe20;
  error_code *in_stack_fffffffffffffe28;
  basic_errors in_stack_fffffffffffffe3c;
  ActionMessage *in_stack_fffffffffffffe40;
  lock_handle<std::pair<bool,_bool>,_std::mutex> local_30;
  error_code *local_18;
  
  local_18 = in_RDX;
  gmlc::libguarded::guarded<std::pair<bool,_bool>,_std::mutex>::lock
            ((guarded<std::pair<bool,_bool>,_std::mutex> *)in_stack_fffffffffffffe18);
  ppVar2 = gmlc::libguarded::lock_handle<std::pair<bool,_bool>,_std::mutex>::operator->(&local_30);
  if ((ppVar2->first & 1U) != 0) {
    std::error_code::error_code<asio::error::basic_errors,void>
              ((error_code *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    bVar1 = std::operator==(local_18,in_stack_fffffffffffffe28);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      ActionMessage::ActionMessage(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
      setActionFlag<helics::ActionMessage,helics::GeneralFlags>
                ((ActionMessage *)&stack0xfffffffffffffe38,error_flag);
      BrokerBase::addActionMessage(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffe20);
    }
    else {
      ActionMessage::ActionMessage(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
      BrokerBase::addActionMessage(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffe20);
    }
  }
  ppVar2 = gmlc::libguarded::lock_handle<std::pair<bool,_bool>,_std::mutex>::operator->(&local_30);
  ppVar2->second = false;
  gmlc::libguarded::lock_handle<std::pair<bool,_bool>,_std::mutex>::~lock_handle
            ((lock_handle<std::pair<bool,_bool>,_std::mutex> *)0x44ebb4);
  return;
}

Assistant:

static void
    timerTickHandler(BrokerBase* bbase, activeProtector& active, const std::error_code& error)
{
    auto timeProtector = active.lock();
    if (timeProtector->first) {
        if (error != asio::error::operation_aborted) {
            try {
                bbase->addActionMessage(CMD_TICK);
            }
            catch (std::exception& e) {
                std::cerr << "exception caught from addActionMessage" << e.what() << '\n';
            }
        } else {
            ActionMessage tick(CMD_TICK);
            setActionFlag(tick, error_flag);
            bbase->addActionMessage(tick);
        }
    }
    timeProtector->second = false;
}